

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O1

int archive_read_format_cpio_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  void *pvVar1;
  long request;
  int iVar2;
  size_t in_RAX;
  void *pvVar3;
  int64_t iVar4;
  ssize_t bytes_read;
  size_t local_38;
  
  pvVar1 = a->format->data;
  local_38 = in_RAX;
  if (*(long *)((long)pvVar1 + 0x20) != 0) {
    __archive_read_consume(a,*(long *)((long)pvVar1 + 0x20));
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
  }
  if (*(long *)((long)pvVar1 + 0x18) < 1) {
    request = *(long *)((long)pvVar1 + 0x30);
    iVar4 = __archive_read_consume(a,request);
    iVar2 = -0x1e;
    if (request == iVar4) {
      *(undefined8 *)((long)pvVar1 + 0x30) = 0;
      *buff = (void *)0x0;
      *size = 0;
      *offset = *(int64_t *)((long)pvVar1 + 0x28);
      iVar2 = 1;
    }
  }
  else {
    pvVar3 = __archive_read_ahead(a,1,(ssize_t *)&local_38);
    *buff = pvVar3;
    if ((long)local_38 < 1) {
      iVar2 = -0x1e;
    }
    else {
      if ((long)*(size_t *)((long)pvVar1 + 0x18) < (long)local_38) {
        local_38 = *(size_t *)((long)pvVar1 + 0x18);
      }
      *size = local_38;
      *(size_t *)((long)pvVar1 + 0x20) = local_38;
      *offset = *(int64_t *)((long)pvVar1 + 0x28);
      *(long *)((long)pvVar1 + 0x28) = *(long *)((long)pvVar1 + 0x28) + local_38;
      *(long *)((long)pvVar1 + 0x18) = *(long *)((long)pvVar1 + 0x18) - local_38;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int
archive_read_format_cpio_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	ssize_t bytes_read;
	struct cpio *cpio;

	cpio = (struct cpio *)(a->format->data);

	if (cpio->entry_bytes_unconsumed) {
		__archive_read_consume(a, cpio->entry_bytes_unconsumed);
		cpio->entry_bytes_unconsumed = 0;
	}

	if (cpio->entry_bytes_remaining > 0) {
		*buff = __archive_read_ahead(a, 1, &bytes_read);
		if (bytes_read <= 0)
			return (ARCHIVE_FATAL);
		if (bytes_read > cpio->entry_bytes_remaining)
			bytes_read = (ssize_t)cpio->entry_bytes_remaining;
		*size = bytes_read;
		cpio->entry_bytes_unconsumed = bytes_read;
		*offset = cpio->entry_offset;
		cpio->entry_offset += bytes_read;
		cpio->entry_bytes_remaining -= bytes_read;
		return (ARCHIVE_OK);
	} else {
		if (cpio->entry_padding !=
			__archive_read_consume(a, cpio->entry_padding)) {
			return (ARCHIVE_FATAL);
		}
		cpio->entry_padding = 0;
		*buff = NULL;
		*size = 0;
		*offset = cpio->entry_offset;
		return (ARCHIVE_EOF);
	}
}